

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImGui::RenderPixelEllipsis(ImDrawList *draw_list,ImVec2 pos,int count,ImU32 col)

{
  ImFont *pIVar1;
  int iVar2;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar3;
  ImVec2 local_68;
  ImVec2 local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  fStack_54 = pos.y;
  pIVar1 = draw_list->_Data->Font;
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = pos;
  local_48._12_4_ = in_XMM0_Dd;
  local_58 = fStack_54 +
             (float)(int)((draw_list->_Data->FontSize / pIVar1->FontSize) * pIVar1->Ascent +
                          (pIVar1->DisplayOffset).y + 0.5 + -1.0);
  fVar3 = local_58 + 1.0;
  iVar2 = 0;
  if (count < 1) {
    count = 0;
  }
  fStack_50 = fStack_54;
  fStack_4c = fStack_54;
  for (; count != iVar2; iVar2 = iVar2 + 1) {
    local_60.x = (float)iVar2 + (float)iVar2 + (float)local_48._0_4_;
    local_60.y = local_58;
    local_68.x = local_60.x + 1.0;
    local_68.y = fVar3;
    ImDrawList::AddRectFilled(draw_list,&local_60,&local_68,col,0.0,0xf);
  }
  return;
}

Assistant:

void ImGui::RenderPixelEllipsis(ImDrawList* draw_list, ImVec2 pos, int count, ImU32 col)
{
    ImFont* font = draw_list->_Data->Font;
    const float font_scale = draw_list->_Data->FontSize / font->FontSize;
    pos.y += (float)(int)(font->DisplayOffset.y + font->Ascent * font_scale + 0.5f - 1.0f);
    for (int dot_n = 0; dot_n < count; dot_n++)
        draw_list->AddRectFilled(ImVec2(pos.x + dot_n * 2.0f, pos.y), ImVec2(pos.x + dot_n * 2.0f + 1.0f, pos.y + 1.0f), col);
}